

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overdrawoptimizer.cpp
# Opt level: O0

void meshopt_optimizeOverdraw
               (uint *destination,uint *indices,size_t index_count,float *vertex_positions,
               size_t vertex_count,size_t vertex_positions_stride,float threshold)

{
  uint uVar1;
  uint *puVar2;
  size_t sVar3;
  meshopt_Allocator *this;
  unsigned_short *size;
  uint *puVar4;
  ulong uVar5;
  ulong in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  long in_R8;
  size_t cluster_end;
  size_t cluster_begin;
  uint cluster;
  size_t it;
  size_t offset;
  uint *sort_order;
  unsigned_short *sort_keys;
  float *sort_data;
  size_t cluster_count;
  uint *clusters;
  size_t soft_cluster_count;
  uint *soft_clusters;
  size_t hard_cluster_count;
  uint *hard_clusters;
  uint *cache_timestamps;
  uint cache_size;
  uint *indices_copy;
  meshopt_Allocator allocator;
  size_t in_stack_00001e58;
  unsigned_short *in_stack_00001e60;
  float *in_stack_00001e68;
  uint *in_stack_00001e70;
  meshopt_Allocator *in_stack_fffffffffffffe10;
  ulong local_1e8;
  uint *in_stack_fffffffffffffe28;
  meshopt_Allocator *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe70;
  float threshold_00;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  uint *in_stack_fffffffffffffe80;
  ulong uVar6;
  size_t in_stack_fffffffffffffe88;
  long lVar7;
  size_t in_stack_fffffffffffffe90;
  uint *in_stack_fffffffffffffe98;
  uint *in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffeb0;
  uint *in_stack_fffffffffffffeb8;
  uint *in_stack_fffffffffffffee8;
  uint *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  size_t in_stack_ffffffffffffff00;
  uint *in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff20;
  uint *local_10;
  
  threshold_00 = (float)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  meshopt_Allocator::meshopt_Allocator(in_stack_fffffffffffffe10);
  if ((in_RDX != 0) && (in_R8 != 0)) {
    local_10 = in_RSI;
    if (in_RDI == in_RSI) {
      in_stack_fffffffffffffef0 =
           meshopt_Allocator::allocate<unsigned_int>
                     (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
      memcpy(in_stack_fffffffffffffef0,in_RSI,in_RDX << 2);
      local_10 = in_stack_fffffffffffffef0;
    }
    in_stack_fffffffffffffe10 =
         (meshopt_Allocator *)
         meshopt_Allocator::allocate<unsigned_int>
                   (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    puVar2 = meshopt_Allocator::allocate<unsigned_int>
                       (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    meshopt::generateHardBoundaries
              (puVar2,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20),in_stack_fffffffffffffe28);
    puVar2 = meshopt_Allocator::allocate<unsigned_int>
                       (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    sVar3 = meshopt::generateSoftBoundaries
                      (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
                       ,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       in_stack_fffffffffffffeb0,threshold_00,in_stack_fffffffffffffeb8);
    this = (meshopt_Allocator *)
           meshopt_Allocator::allocate<float>
                     (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
    meshopt::calculateSortData
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (float *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_ffffffffffffff20
              );
    size = meshopt_Allocator::allocate<unsigned_short>(this,(size_t)in_stack_fffffffffffffe28);
    puVar4 = meshopt_Allocator::allocate<unsigned_int>(this,(size_t)size);
    meshopt::calculateSortOrderRadix
              (in_stack_00001e70,in_stack_00001e68,in_stack_00001e60,in_stack_00001e58);
    lVar7 = 0;
    for (uVar6 = 0; uVar6 < sVar3; uVar6 = uVar6 + 1) {
      uVar1 = puVar4[uVar6];
      uVar5 = (ulong)(puVar2[uVar1] * 3);
      local_1e8 = in_RDX;
      if (uVar1 + 1 < sVar3) {
        local_1e8 = (ulong)(puVar2[uVar1 + 1] * 3);
      }
      memcpy(in_RDI + lVar7,local_10 + uVar5,(local_1e8 - uVar5) * 4);
      lVar7 = (local_1e8 - uVar5) + lVar7;
    }
  }
  meshopt_Allocator::~meshopt_Allocator(in_stack_fffffffffffffe10);
  return;
}

Assistant:

void meshopt_optimizeOverdraw(unsigned int* destination, const unsigned int* indices, size_t index_count, const float* vertex_positions, size_t vertex_count, size_t vertex_positions_stride, float threshold)
{
	using namespace meshopt;

	assert(index_count % 3 == 0);
	assert(vertex_positions_stride > 0 && vertex_positions_stride <= 256);
	assert(vertex_positions_stride % sizeof(float) == 0);

	meshopt_Allocator allocator;

	// guard for empty meshes
	if (index_count == 0 || vertex_count == 0)
		return;

	// support in-place optimization
	if (destination == indices)
	{
		unsigned int* indices_copy = allocator.allocate<unsigned int>(index_count);
		memcpy(indices_copy, indices, index_count * sizeof(unsigned int));
		indices = indices_copy;
	}

	unsigned int cache_size = 16;

	unsigned int* cache_timestamps = allocator.allocate<unsigned int>(vertex_count);

	// generate hard boundaries from full-triangle cache misses
	unsigned int* hard_clusters = allocator.allocate<unsigned int>(index_count / 3);
	size_t hard_cluster_count = generateHardBoundaries(hard_clusters, indices, index_count, vertex_count, cache_size, cache_timestamps);

	// generate soft boundaries
	unsigned int* soft_clusters = allocator.allocate<unsigned int>(index_count / 3 + 1);
	size_t soft_cluster_count = generateSoftBoundaries(soft_clusters, indices, index_count, vertex_count, hard_clusters, hard_cluster_count, cache_size, threshold, cache_timestamps);

	const unsigned int* clusters = soft_clusters;
	size_t cluster_count = soft_cluster_count;

	// fill sort data
	float* sort_data = allocator.allocate<float>(cluster_count);
	calculateSortData(sort_data, indices, index_count, vertex_positions, vertex_positions_stride, clusters, cluster_count);

	// sort clusters using sort data
	unsigned short* sort_keys = allocator.allocate<unsigned short>(cluster_count);
	unsigned int* sort_order = allocator.allocate<unsigned int>(cluster_count);
	calculateSortOrderRadix(sort_order, sort_data, sort_keys, cluster_count);

	// fill output buffer
	size_t offset = 0;

	for (size_t it = 0; it < cluster_count; ++it)
	{
		unsigned int cluster = sort_order[it];
		assert(cluster < cluster_count);

		size_t cluster_begin = clusters[cluster] * 3;
		size_t cluster_end = (cluster + 1 < cluster_count) ? clusters[cluster + 1] * 3 : index_count;
		assert(cluster_begin < cluster_end);

		memcpy(destination + offset, indices + cluster_begin, (cluster_end - cluster_begin) * sizeof(unsigned int));
		offset += cluster_end - cluster_begin;
	}

	assert(offset == index_count);
}